

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

Prog * re2::Compiler::Compile(Regexp *re,bool reversed,int64 max_mem)

{
  ushort uVar1;
  Regexp *this;
  bool bVar2;
  bool bVar3;
  Frag FVar4;
  Frag FVar5;
  Prog *pPVar6;
  Regexp *sre;
  Compiler c;
  Regexp *local_b8;
  Compiler local_b0;
  
  Compiler(&local_b0);
  uVar1 = re->parse_flags_;
  (local_b0.prog_)->flags_ = (uint)uVar1;
  if ((uVar1 & 0x20) != 0) {
    local_b0.encoding_ = kEncodingLatin1;
  }
  if (max_mem < 1) {
    local_b0.max_inst_ = 100000;
  }
  else {
    local_b0.max_inst_ = 0;
    if (0x1b8 < (ulong)max_mem) {
      local_b0.max_inst_ = 0x1000000;
      if (max_mem - 0x1b8U < 0x8000000) {
        local_b0.max_inst_ = (int)(max_mem - 0x1b8U >> 3);
      }
    }
  }
  local_b0.anchor_ = ANCHOR_BOTH;
  local_b0.reversed_ = reversed;
  local_b0.max_mem_ = max_mem;
  local_b8 = Regexp::Simplify(re);
  if (local_b8 != (Regexp *)0x0) {
    bVar2 = IsAnchorStart(&local_b8,0);
    bVar3 = IsAnchorEnd(&local_b8,0);
    this = local_b8;
    local_b0.super_Walker<re2::Frag>.max_visits_ = local_b0.max_inst_ * 2;
    FVar4 = Regexp::Walker<re2::Frag>::WalkInternal
                      (&local_b0.super_Walker<re2::Frag>,local_b8,(Frag)0x0,false);
    Regexp::Decref(this);
    if (local_b0.failed_ == false) {
      local_b0.reversed_ = false;
      FVar5 = Match(&local_b0,0);
      FVar4 = Cat(&local_b0,FVar4,FVar5);
      (local_b0.prog_)->start_ = FVar4.begin;
      if (reversed) {
        (local_b0.prog_)->anchor_start_ = bVar3;
        (local_b0.prog_)->anchor_end_ = bVar2;
      }
      else {
        (local_b0.prog_)->anchor_start_ = bVar2;
        (local_b0.prog_)->anchor_end_ = bVar3;
        bVar3 = bVar2;
      }
      if (!bVar3) {
        FVar5 = ByteRange(&local_b0,0,0xff,false);
        FVar5 = Star(&local_b0,FVar5,true);
        FVar4 = Cat(&local_b0,FVar5,FVar4);
      }
      (local_b0.prog_)->start_unanchored_ = FVar4.begin;
      (local_b0.prog_)->reversed_ = reversed;
      pPVar6 = Finish(&local_b0);
      goto LAB_0012f71d;
    }
  }
  pPVar6 = (Prog *)0x0;
LAB_0012f71d:
  ~Compiler(&local_b0);
  return pPVar6;
}

Assistant:

Prog* Compiler::Compile(Regexp* re, bool reversed, int64 max_mem) {
  Compiler c;

  c.Setup(re->parse_flags(), max_mem, RE2::ANCHOR_BOTH /* unused */);
  c.reversed_ = reversed;

  // Simplify to remove things like counted repetitions
  // and character classes like \d.
  Regexp* sre = re->Simplify();
  if (sre == NULL)
    return NULL;

  // Record whether prog is anchored, removing the anchors.
  // (They get in the way of other optimizations.)
  bool is_anchor_start = IsAnchorStart(&sre, 0);
  bool is_anchor_end = IsAnchorEnd(&sre, 0);

  // Generate fragment for entire regexp.
  Frag f = c.WalkExponential(sre, Frag(), 2*c.max_inst_);
  sre->Decref();
  if (c.failed_)
    return NULL;

  // Success!  Finish by putting Match node at end, and record start.
  // Turn off c.reversed_ (if it is set) to force the remaining concatenations
  // to behave normally.
  c.reversed_ = false;
  Frag all = c.Cat(f, c.Match(0));
  c.prog_->set_start(all.begin);

  if (reversed) {
    c.prog_->set_anchor_start(is_anchor_end);
    c.prog_->set_anchor_end(is_anchor_start);
  } else {
    c.prog_->set_anchor_start(is_anchor_start);
    c.prog_->set_anchor_end(is_anchor_end);
  }

  // Also create unanchored version, which starts with a .*? loop.
  if (c.prog_->anchor_start()) {
    c.prog_->set_start_unanchored(c.prog_->start());
  } else {
    Frag unanchored = c.Cat(c.DotStar(), all);
    c.prog_->set_start_unanchored(unanchored.begin);
  }

  c.prog_->set_reversed(reversed);

  // Hand ownership of prog_ to caller.
  return c.Finish();
}